

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O2

void CSOAA::output_example(vw *all,example *ec,bool *hit_loss,multi_ex *ec_seq,ldf *data)

{
  uint64_t *puVar1;
  wclass *pwVar2;
  wclass *pwVar3;
  pointer ppeVar4;
  int *piVar5;
  _func_void_int_string_v_array<char> *p_Var6;
  v_array<char> vVar7;
  bool bVar8;
  char cVar9;
  int iVar10;
  polyprediction *ppVar11;
  long lVar12;
  ostream *poVar13;
  uint32_t *puVar14;
  byte bVar15;
  ulong uVar16;
  float *pfVar17;
  ulong uVar18;
  int *piVar19;
  float fVar20;
  undefined8 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde8;
  uint32_t prediction;
  polylabel *ppVar21;
  string local_1f8 [32];
  string outputString;
  stringstream outputStringStream;
  ostream local_1a8;
  
  pwVar2 = (ec->l).cs.costs._begin;
  pwVar3 = (ec->l).cs.costs._end;
  iVar10 = example_is_newline(ec);
  if ((iVar10 == 0) && (bVar8 = ec_is_label_definition(ec), !bVar8)) {
    puVar1 = &all->sd->total_features;
    *puVar1 = *puVar1 + ec->num_features;
    ppVar21 = &ec->l;
    if (data->is_probabilities == true) {
      ppeVar4 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      fVar20 = 3.4028235e+38;
      uVar18 = 0;
      for (uVar16 = 0;
          (long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)ppeVar4 >> 3 != uVar16;
          uVar16 = uVar16 + 1) {
        if (ppeVar4[uVar16]->partial_prediction < fVar20) {
          uVar18 = uVar16 & 0xffffffff;
          fVar20 = ppeVar4[uVar16]->partial_prediction;
        }
      }
      ppVar11 = (polyprediction *)&((ppeVar4[uVar18]->l).cs.costs._begin)->class_index;
    }
    else {
      ppVar11 = &ec->pred;
    }
    prediction = ppVar11->multiclass;
    cVar9 = (*(code *)PTR_test_label_002b2dc0)(ppVar21);
    if (cVar9 == '\0') {
      lVar12 = (long)pwVar3 - (long)pwVar2 >> 4;
      bVar15 = *hit_loss;
      puVar14 = &pwVar2->class_index;
      fVar20 = 0.0;
      while ((bVar8 = lVar12 != 0, lVar12 = lVar12 + -1, bVar8 && ((bVar15 & 1) == 0))) {
        if (prediction == *puVar14) {
          fVar20 = ((wclass *)(puVar14 + -1))->x;
          *hit_loss = true;
          bVar15 = 1;
        }
        puVar14 = puVar14 + 4;
      }
      all->sd->sum_loss = all->sd->sum_loss + (double)fVar20;
      all->sd->sum_loss_since_last_dump = (double)fVar20 + all->sd->sum_loss_since_last_dump;
    }
    piVar5 = (all->final_prediction_sink)._end;
    for (piVar19 = (all->final_prediction_sink)._begin; piVar19 != piVar5; piVar19 = piVar19 + 1) {
      fVar20 = (ec->pred).scalar;
      if (data->is_probabilities == false) {
        fVar20 = (float)(uint)fVar20;
      }
      (*all->print)(*piVar19,fVar20,0.0,ec->tag);
    }
    if (0 < all->raw_prediction) {
      outputString._M_dataplus._M_p = (pointer)&outputString.field_2;
      outputString._M_string_length = 0;
      outputString.field_2._M_local_buf[0] = '\0';
      std::__cxx11::stringstream::stringstream
                ((stringstream *)&outputStringStream,(string *)&outputString,_S_out|_S_in);
      pfVar17 = &pwVar2->partial_prediction;
      for (lVar12 = 0; (long)pwVar3 - (long)pwVar2 >> 4 != lVar12; lVar12 = lVar12 + 1) {
        if (lVar12 != 0) {
          std::operator<<(&local_1a8,' ');
        }
        poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
        poVar13 = std::operator<<(poVar13,':');
        std::ostream::operator<<(poVar13,*pfVar17);
        pfVar17 = pfVar17 + 4;
      }
      p_Var6 = all->print_text;
      iVar10 = all->raw_prediction;
      std::__cxx11::stringbuf::str();
      vVar7._end = (char *)all;
      vVar7._begin = (char *)in_stack_fffffffffffffdd8;
      vVar7.end_array._0_4_ = in_stack_fffffffffffffde8;
      vVar7.end_array._4_4_ = prediction;
      vVar7.erase_count = (size_t)ppVar21;
      (*p_Var6)(iVar10,(string)ec->tag,vVar7);
      std::__cxx11::string::~string(local_1f8);
      std::__cxx11::stringstream::~stringstream((stringstream *)&outputStringStream);
      std::__cxx11::string::~string((string *)&outputString);
    }
    bVar8 = (bool)(*(code *)PTR_test_label_002b2dc0)(ppVar21);
    COST_SENSITIVE::print_update(all,bVar8,ec,ec_seq,false,prediction);
  }
  return;
}

Assistant:

void output_example(vw& all, example& ec, bool& hit_loss, multi_ex* ec_seq, ldf& data)
{
  label& ld = ec.l.cs;
  v_array<COST_SENSITIVE::wclass> costs = ld.costs;

  if (example_is_newline(ec))
    return;
  if (ec_is_label_definition(ec))
    return;

  all.sd->total_features += ec.num_features;

  float loss = 0.;

  uint32_t predicted_class;
  if (data.is_probabilities)
  {
    // predicted_K was already computed in do_actual_learning(),
    // but we cannot store it in ec.pred union because we store ec.pred.prob there.
    // So we must compute it again.
    uint32_t predicted_K = 0;
    float min_score = FLT_MAX;
    for (size_t k = 0; k < ec_seq->size(); k++)
    {
      example* ec_k = (*ec_seq)[k];
      if (ec_k->partial_prediction < min_score)
      {
        min_score = ec_k->partial_prediction;
        predicted_K = (uint32_t)k;
      }
    }
    predicted_class = (*ec_seq)[predicted_K]->l.cs.costs[0].class_index;
  }
  else
    predicted_class = ec.pred.multiclass;

  if (!COST_SENSITIVE::cs_label.test_label(&ec.l))
  {
    for (size_t j = 0; j < costs.size(); j++)
    {
      if (hit_loss)
        break;
      if (predicted_class == costs[j].class_index)
      {
        loss = costs[j].x;
        hit_loss = true;
      }
    }

    all.sd->sum_loss += loss;
    all.sd->sum_loss_since_last_dump += loss;
  }

  for (int sink : all.final_prediction_sink)
    all.print(sink, data.is_probabilities ? ec.pred.prob : (float)ec.pred.multiclass, 0, ec.tag);

  if (all.raw_prediction > 0)
  {
    string outputString;
    stringstream outputStringStream(outputString);
    for (size_t i = 0; i < costs.size(); i++)
    {
      if (i > 0)
        outputStringStream << ' ';
      outputStringStream << costs[i].class_index << ':' << costs[i].partial_prediction;
    }
    // outputStringStream << endl;
    all.print_text(all.raw_prediction, outputStringStream.str(), ec.tag);
  }

  COST_SENSITIVE::print_update(all, COST_SENSITIVE::cs_label.test_label(&ec.l), ec, ec_seq, false, predicted_class);
}